

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5InitVtab(int bCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  u64 n;
  Fts5Config *pFVar1;
  int iVar2;
  int iVar3;
  Fts5Index *pFVar4;
  Fts5Storage *p;
  size_t sVar5;
  char *pcVar6;
  Fts5Structure *pStruct;
  char *pcVar7;
  int iVar8;
  Fts5FullTable *pTab;
  long lVar9;
  int rc_1;
  int rc;
  int local_58;
  int local_54;
  Fts5Config *local_50;
  Fts5Storage *local_48;
  sqlite3_vtab **local_40;
  Fts5FullTable *local_38;
  
  local_48 = (Fts5Storage *)CONCAT44(local_48._4_4_,bCreate);
  local_54 = 0;
  local_50 = (Fts5Config *)0x0;
  local_38 = (Fts5FullTable *)sqlite3Fts5MallocZero(&local_54,0x40);
  if (local_54 == 0) {
    local_54 = sqlite3Fts5ConfigParse((Fts5Global *)pAux,db,argc,argv,&local_50,pzErr);
  }
  pTab = local_38;
  pFVar1 = local_50;
  if (local_54 == 0) {
    (local_38->p).pConfig = local_50;
    local_38->pGlobal = (Fts5Global *)pAux;
    local_58 = 0;
    pFVar4 = (Fts5Index *)sqlite3Fts5MallocZero(&local_58,0x88);
    (pTab->p).pIndex = pFVar4;
    if (local_58 == 0) {
      pFVar4->pConfig = pFVar1;
      pFVar4->nWorkUnit = 0x40;
      pcVar6 = sqlite3Fts5Mprintf(&local_58,"%s_data",pFVar1->zName);
      pFVar4->zDataTbl = pcVar6;
      if (((int)local_48 != 0) && (pcVar6 != (char *)0x0)) {
        local_58 = sqlite3Fts5CreateTable
                             (pFVar1,"data","id INTEGER PRIMARY KEY, block BLOB",0,pzErr);
        if (local_58 == 0) {
          local_58 = sqlite3Fts5CreateTable
                               (pFVar1,"idx","segid, term, pgno, PRIMARY KEY(segid, term)",1,pzErr);
        }
        if (local_58 == 0) {
          local_58 = sqlite3Fts5IndexReinit(pFVar4);
        }
      }
    }
    iVar2 = local_58;
    if (local_58 != 0) {
      sqlite3Fts5IndexClose(pFVar4);
      (pTab->p).pIndex = (Fts5Index *)0x0;
    }
    local_54 = iVar2;
  }
  pFVar1 = local_50;
  iVar2 = local_54;
  if (local_54 == 0) {
    pFVar4 = (pTab->p).pIndex;
    n = (long)local_50->nCol * 8 + 0x80;
    local_40 = ppVTab;
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      p = (Fts5Storage *)sqlite3Malloc(n);
    }
    else {
      p = (Fts5Storage *)0x0;
    }
    pTab->pStorage = p;
    if (p == (Fts5Storage *)0x0) {
      ppVTab = local_40;
      iVar2 = 7;
    }
    else {
      iVar2 = 0;
      memset(p,0,n);
      p->aTotalSize = (i64 *)(p + 1);
      p->pConfig = pFVar1;
      p->pIndex = pFVar4;
      if ((int)local_48 != 0) {
        iVar2 = 0;
        if (pFVar1->eContent == 0) {
          iVar2 = pFVar1->nCol;
          iVar3 = sqlite3_initialize();
          if (iVar3 == 0) {
            pcVar6 = (char *)sqlite3Malloc((long)iVar2 * 10 + 0x20);
          }
          else {
            pcVar6 = (char *)0x0;
          }
          if (pcVar6 == (char *)0x0) {
            iVar2 = 7;
          }
          else {
            iVar2 = iVar2 * 10 + 0x20;
            local_48 = p;
            sqlite3_snprintf(iVar2,pcVar6,"id INTEGER PRIMARY KEY");
            if (0 < pFVar1->nCol) {
              sVar5 = strlen(pcVar6);
              iVar3 = 0;
              do {
                iVar8 = (int)sVar5;
                sqlite3_snprintf(iVar2 - iVar8,pcVar6 + iVar8,", c%d");
                sVar5 = strlen(pcVar6 + iVar8);
                sVar5 = (size_t)(uint)(iVar8 + (int)sVar5);
                iVar3 = iVar3 + 1;
              } while (iVar3 < pFVar1->nCol);
            }
            iVar2 = sqlite3Fts5CreateTable(pFVar1,"content",pcVar6,0,pzErr);
            pTab = local_38;
            p = local_48;
          }
          sqlite3_free(pcVar6);
        }
        if (iVar2 == 0) {
          if (pFVar1->bColumnsize == 0) {
            iVar2 = 0;
          }
          else {
            iVar2 = sqlite3Fts5CreateTable
                              (pFVar1,"docsize","id INTEGER PRIMARY KEY, sz BLOB",0,pzErr);
          }
        }
        if (iVar2 == 0) {
          iVar2 = sqlite3Fts5CreateTable(pFVar1,"config","k PRIMARY KEY, v",1,pzErr);
        }
        if (iVar2 == 0) {
          iVar2 = sqlite3Fts5StorageConfigValue(p,"version",(sqlite3_value *)0x0,4);
        }
      }
      ppVTab = local_40;
      if (iVar2 != 0) {
        sqlite3Fts5StorageClose(p);
        pTab->pStorage = (Fts5Storage *)0x0;
      }
    }
  }
  local_54 = iVar2;
  pFVar1 = local_50;
  if (local_54 == 0) {
    local_58 = 0;
    local_40 = ppVTab;
    pcVar6 = sqlite3Fts5Mprintf(&local_58,"CREATE TABLE x(");
    if (pcVar6 != (char *)0x0) {
      lVar9 = 0;
      do {
        if (pFVar1->nCol <= lVar9) break;
        pcVar7 = ", ";
        if (lVar9 == 0) {
          pcVar7 = "";
        }
        pcVar6 = sqlite3Fts5Mprintf(&local_58,"%z%s%Q",pcVar6,pcVar7,pFVar1->azCol[lVar9]);
        lVar9 = lVar9 + 1;
      } while (pcVar6 != (char *)0x0);
    }
    pcVar6 = sqlite3Fts5Mprintf(&local_58,"%z, %Q HIDDEN, %s HIDDEN)",pcVar6,pFVar1->zName,"rank");
    pTab = local_38;
    ppVTab = local_40;
    if (pcVar6 != (char *)0x0) {
      local_58 = sqlite3_declare_vtab(pFVar1->db,pcVar6);
      sqlite3_free(pcVar6);
    }
    local_54 = local_58;
  }
  pFVar1 = local_50;
  if (local_54 == 0) {
    local_50->pzErrmsg = pzErr;
    pFVar4 = (pTab->p).pIndex;
    pStruct = fts5StructureRead(pFVar4);
    fts5StructureRelease(pStruct);
    local_54 = pFVar4->rc;
    pFVar4->rc = 0;
    sqlite3Fts5IndexRollback((pTab->p).pIndex);
    pFVar1->pzErrmsg = (char **)0x0;
  }
  iVar2 = local_54;
  if (local_54 != 0) {
    fts5FreeVtab(pTab);
    pTab = (Fts5FullTable *)0x0;
  }
  *ppVTab = (sqlite3_vtab *)pTab;
  return iVar2;
}

Assistant:

static int fts5InitVtab(
  int bCreate,                    /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts5Global *pGlobal = (Fts5Global*)pAux;
  const char **azConfig = (const char**)argv;
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pConfig = 0;        /* Results of parsing argc/argv */
  Fts5FullTable *pTab = 0;        /* New virtual table object */

  /* Allocate the new vtab object and parse the configuration */
  pTab = (Fts5FullTable*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5FullTable));
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigParse(pGlobal, db, argc, azConfig, &pConfig, pzErr);
    assert( (rc==SQLITE_OK && *pzErr==0) || pConfig==0 );
  }
  if( rc==SQLITE_OK ){
    pTab->p.pConfig = pConfig;
    pTab->pGlobal = pGlobal;
  }

  /* Open the index sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexOpen(pConfig, bCreate, &pTab->p.pIndex, pzErr);
  }

  /* Open the storage sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageOpen(
        pConfig, pTab->p.pIndex, bCreate, &pTab->pStorage, pzErr
    );
  }

  /* Call sqlite3_declare_vtab() */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigDeclareVtab(pConfig);
  }

  /* Load the initial configuration */
  if( rc==SQLITE_OK ){
    assert( pConfig->pzErrmsg==0 );
    pConfig->pzErrmsg = pzErr;
    rc = sqlite3Fts5IndexLoadConfig(pTab->p.pIndex);
    sqlite3Fts5IndexRollback(pTab->p.pIndex);
    pConfig->pzErrmsg = 0;
  }

  if( rc!=SQLITE_OK ){
    fts5FreeVtab(pTab);
    pTab = 0;
  }else if( bCreate ){
    fts5CheckTransactionState(pTab, FTS5_BEGIN, 0);
  }
  *ppVTab = (sqlite3_vtab*)pTab;
  return rc;
}